

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O2

TPZCompEl * TPZPostProcAnalysis::CreateTetraEl(TPZGeoEl *gel,TPZCompMesh *mesh)

{
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTetra>_> *this;
  
  if ((gel->fReference == (TPZCompEl *)0x0) && (gel->fNumInterfaces == 0)) {
    this = (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTetra>_> *)operator_new(0xf0);
    TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTetra>_>::TPZCompElPostProc(this,mesh,gel);
  }
  else {
    this = (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTetra>_> *)0x0;
  }
  return (TPZCompEl *)this;
}

Assistant:

TPZCompEl *TPZPostProcAnalysis::CreateTetraEl(TPZGeoEl *gel,TPZCompMesh &mesh) {
	if(!gel->Reference() && gel->NumInterfaces() == 0)
		return new TPZCompElPostProc<TPZCompElH1<TPZShapeTetra> >(mesh,gel);
	return NULL;
}